

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookbehind_matcher.hpp
# Opt level: O3

bool __thiscall
boost::xpressive::detail::
lookbehind_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (lookbehind_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
           *this,long *state,long *next)

{
  lookbehind_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
  lVar1;
  long lVar2;
  long lVar3;
  undefined1 uVar4;
  char cVar5;
  long lVar6;
  
  lVar2 = *state;
  lVar3 = *(long *)(this + 0x10);
  if (lVar3 < 0) {
    lVar6 = state[3] - lVar2;
    if (SBORROW8(lVar6,-lVar3) == lVar6 + lVar3 < 0) goto LAB_00136df8;
  }
  else if (lVar3 <= lVar2 - state[3] || lVar3 == 0) {
LAB_00136df8:
    *state = -lVar3 + lVar2;
    lVar1 = this[8];
    cVar5 = (**(code **)(**(long **)this + 0x10))(*(long **)this,state);
    if (lVar1 == (lookbehind_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
                  )0x1) {
      if (cVar5 != '\0') {
        return false;
      }
      *state = lVar2;
    }
    else if (cVar5 == '\0') {
      *state = lVar2;
      return false;
    }
    cVar5 = (**(code **)(*next + 0x10))(next,state);
    if (cVar5 == '\0') {
      return false;
    }
    return true;
  }
  if (this[8] !=
      (lookbehind_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
       )0x1) {
    return false;
  }
  uVar4 = (**(code **)(*next + 0x10))(next,state);
  return (bool)uVar4;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, mpl::true_) const
        {
            typedef typename iterator_difference<BidiIter>::type difference_type;
            BidiIter const tmp = state.cur_;
            if(!detail::advance_to(state.cur_, -static_cast<difference_type>(this->width_), state.begin_))
            {
                state.cur_ = tmp;
                return this->not_ ? next.match(state) : false;
            }

            if(this->not_)
            {
                if(this->xpr_.match(state))
                {
                    BOOST_ASSERT(state.cur_ == tmp);
                    return false;
                }
                state.cur_ = tmp;
                if(next.match(state))
                {
                    return true;
                }
            }
            else
            {
                if(!this->xpr_.match(state))
                {
                    state.cur_ = tmp;
                    return false;
                }
                BOOST_ASSERT(state.cur_ == tmp);
                if(next.match(state))
                {
                    return true;
                }
            }

            BOOST_ASSERT(state.cur_ == tmp);
            return false;
        }